

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dumper.cpp
# Opt level: O3

string * __thiscall
arangodb::velocypack::Dumper::toString_abi_cxx11_
          (string *__return_storage_ptr__,Dumper *this,Slice slice,Options *options)

{
  Dumper dumper;
  StringSink sink;
  Dumper local_40;
  Sink local_28;
  string *local_20;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_28._vptr_Sink = (_func_int **)&PTR__Sink_00118d08;
  local_20 = __return_storage_ptr__;
  Dumper(&local_40,&local_28,(Options *)slice._start);
  dump(&local_40,(Slice)this);
  return __return_storage_ptr__;
}

Assistant:

std::string Dumper::toString(Slice slice, Options const* options) {
  std::string buffer;
  StringSink sink(&buffer);
  dump(slice, &sink, options);
  return buffer;
}